

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaHash.c
# Opt level: O0

void Gia_ManHashAlloc(Gia_Man_t *p)

{
  int iVar1;
  int b;
  uint local_1c;
  Gia_Man_t *p_local;
  
  iVar1 = Vec_IntSize(&p->vHTable);
  if (iVar1 == 0) {
    iVar1 = Gia_ManAndNum(p);
    if (iVar1 == 0) {
      local_1c = p->nObjsAlloc;
    }
    else {
      iVar1 = Gia_ManAndNum(p);
      local_1c = iVar1 + 1000;
    }
    iVar1 = Abc_PrimeCudd(local_1c);
    Vec_IntFill(&p->vHTable,iVar1,0);
    iVar1 = Vec_IntSize(&p->vHTable);
    b = Gia_ManObjNum(p);
    iVar1 = Abc_MaxInt(iVar1,b);
    Vec_IntGrow(&p->vHash,iVar1);
    iVar1 = Gia_ManObjNum(p);
    Vec_IntFill(&p->vHash,iVar1,0);
    return;
  }
  __assert_fail("Vec_IntSize(&p->vHTable) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaHash.c"
                ,0x6b,"void Gia_ManHashAlloc(Gia_Man_t *)");
}

Assistant:

void Gia_ManHashAlloc( Gia_Man_t * p )  
{
    assert( Vec_IntSize(&p->vHTable) == 0 );
    Vec_IntFill( &p->vHTable, Abc_PrimeCudd( Gia_ManAndNum(p) ? Gia_ManAndNum(p) + 1000 : p->nObjsAlloc ), 0 );
    Vec_IntGrow( &p->vHash, Abc_MaxInt(Vec_IntSize(&p->vHTable), Gia_ManObjNum(p)) );
    Vec_IntFill( &p->vHash, Gia_ManObjNum(p), 0 );
//printf( "Alloced table with %d entries.\n", Vec_IntSize(&p->vHTable) );
}